

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O3

void __thiscall
soplex::
SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::collectBreakpointsMax
          (SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int *nBp,int *minIdx,int *idx,int nnz,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *upd,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *vec,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *upp,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *low,BreakpointSource src)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  uint *puVar2;
  undefined8 uVar3;
  pointer pBVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  double *pdVar8;
  fpclass_type fVar9;
  int32_t iVar10;
  cpp_dec_float<50U,_int,_void> *v;
  cpp_dec_float<50U,_int,_void> *pcVar11;
  int32_t *piVar12;
  cpp_dec_float<50U,_int,_void> local_228;
  int local_1ec;
  cpp_dec_float<50U,_int,_void> local_1e8;
  cpp_dec_float<50U,_int,_void> local_1a8;
  cpp_dec_float<50U,_int,_void> *local_168;
  Array<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>
  *local_160;
  cpp_dec_float<50U,_int,_void> local_158;
  cpp_dec_float<50U,_int,_void> local_118;
  int *local_e0;
  cpp_dec_float<50U,_int,_void> local_d8;
  int *local_a0;
  cpp_dec_float<50U,_int,_void> local_98;
  undefined4 local_58;
  uint uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  double local_48;
  undefined8 uStack_40;
  
  local_1a8.fpclass = cpp_dec_float_finite;
  local_1a8.prec_elem = 10;
  local_1a8.data._M_elems[0] = 0;
  local_1a8.data._M_elems[1] = 0;
  local_1a8.data._M_elems[2] = 0;
  local_1a8.data._M_elems[3] = 0;
  local_1a8.data._M_elems[4] = 0;
  local_1a8.data._M_elems[5] = 0;
  local_1a8.data._M_elems._24_5_ = 0;
  local_1a8.data._M_elems[7]._1_3_ = 0;
  local_1a8.data._M_elems._32_5_ = 0;
  local_1a8.data._M_elems[9]._1_3_ = 0;
  local_1a8.exp = 0;
  local_1a8.neg = false;
  local_e0 = minIdx;
  if (*nBp == 0) {
    ::soplex::infinity::__tls_init();
    pdVar8 = (double *)__tls_get_addr(&PTR_003b4b70);
    piVar12 = &local_228.prec_elem;
    local_228.fpclass = cpp_dec_float_finite;
    local_228.prec_elem = 10;
    local_228.data._M_elems[0] = 0;
    local_228.data._M_elems[1] = 0;
    local_228.data._M_elems[2] = 0;
    local_228.data._M_elems[3] = 0;
    local_228.data._M_elems[4] = 0;
    local_228.data._M_elems[5] = 0;
    local_228.data._M_elems[6] = 0;
    local_228.data._M_elems[7] = 0;
    local_228.data._M_elems._32_5_ = 0;
    local_228.data._M_elems[9]._1_3_ = 0;
    local_228.exp = 0;
    local_228.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_228,*pdVar8);
    local_158.exp = local_228.exp;
    local_158.fpclass = local_228.fpclass;
    local_158.neg = local_228.neg;
  }
  else {
    pBVar4 = (this->breakpoints).data.
             super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
             ._M_impl.super__Vector_impl_data._M_start + *minIdx;
    piVar12 = (int32_t *)((long)&(pBVar4->val).m_backend + 0x34);
    uVar3 = *(undefined8 *)((long)&(pBVar4->val).m_backend + 0x20);
    local_228.data._M_elems._32_5_ = SUB85(uVar3,0);
    local_228.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
    local_228.data._M_elems._0_8_ = *(undefined8 *)&(pBVar4->val).m_backend;
    local_228.data._M_elems._8_8_ = *(undefined8 *)((long)&(pBVar4->val).m_backend + 8);
    local_228.data._M_elems._16_8_ = *(undefined8 *)((long)&(pBVar4->val).m_backend + 0x10);
    uVar3 = *(undefined8 *)((long)&(pBVar4->val).m_backend + 0x18);
    local_228.data._M_elems[6] = (uint)uVar3;
    local_228.data._M_elems[7] = (uint)((ulong)uVar3 >> 0x20);
    local_158.neg = *(bool *)((long)&(pBVar4->val).m_backend + 0x2c);
    local_158.exp = *(int *)((long)&(pBVar4->val).m_backend + 0x28);
    local_158.fpclass = *(fpclass_type *)((long)&(pBVar4->val).m_backend + 0x30);
  }
  local_158.data._M_elems[9]._1_3_ = local_228.data._M_elems[9]._1_3_;
  local_158.data._M_elems._32_5_ = local_228.data._M_elems._32_5_;
  local_158.data._M_elems[4] = local_228.data._M_elems[4];
  local_158.data._M_elems[5] = local_228.data._M_elems[5];
  local_158.data._M_elems[7] = local_228.data._M_elems[7];
  local_158.data._M_elems[6] = local_228.data._M_elems[6];
  local_158.data._M_elems[0] = local_228.data._M_elems[0];
  local_158.data._M_elems[1] = local_228.data._M_elems[1];
  local_158.data._M_elems[2] = local_228.data._M_elems[2];
  local_158.data._M_elems[3] = local_228.data._M_elems[3];
  local_158.prec_elem = *piVar12;
  if (0 < nnz) {
    local_a0 = idx + nnz;
    pnVar1 = &(this->
              super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).epsilon;
    pdVar8 = (double *)__tls_get_addr(&PTR_003b4b70);
    local_48 = *pdVar8;
    local_58 = SUB84(local_48,0);
    local_168 = &(this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).fastDelta.m_backend;
    local_160 = &this->breakpoints;
    uStack_40 = 0;
    uStack_54 = (uint)((ulong)local_48 >> 0x20) ^ 0x80000000;
    uStack_50 = 0;
    uStack_4c = 0x80000000;
    do {
      iVar7 = *idx;
      local_98.data._M_elems._32_8_ = *(undefined8 *)(upd[iVar7].m_backend.data._M_elems + 8);
      local_98.data._M_elems._0_8_ = *(undefined8 *)upd[iVar7].m_backend.data._M_elems;
      local_98.data._M_elems._8_8_ = *(undefined8 *)(upd[iVar7].m_backend.data._M_elems + 2);
      puVar2 = upd[iVar7].m_backend.data._M_elems + 4;
      local_98.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_98.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      local_98.exp = upd[iVar7].m_backend.exp;
      local_98.neg = upd[iVar7].m_backend.neg;
      local_98.fpclass = upd[iVar7].m_backend.fpclass;
      local_98.prec_elem = upd[iVar7].m_backend.prec_elem;
      uVar3 = *(undefined8 *)
               ((this->
                super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).epsilon.m_backend.data._M_elems + 8);
      local_228.data._M_elems._32_5_ = SUB85(uVar3,0);
      local_228.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_228.data._M_elems._0_8_ = *(undefined8 *)(pnVar1->m_backend).data._M_elems;
      local_228.data._M_elems._8_8_ =
           *(undefined8 *)
            ((this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).epsilon.m_backend.data._M_elems + 2);
      local_228.data._M_elems._16_8_ =
           *(undefined8 *)
            ((this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).epsilon.m_backend.data._M_elems + 4);
      uVar3 = *(undefined8 *)
               ((this->
                super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).epsilon.m_backend.data._M_elems + 6);
      local_228.data._M_elems[6] = (uint)uVar3;
      local_228.data._M_elems[7] = (uint)((ulong)uVar3 >> 0x20);
      local_228.exp =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.exp;
      local_228.neg =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.neg;
      fVar9 = (this->
              super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).epsilon.m_backend.fpclass;
      iVar10 = (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).epsilon.m_backend.prec_elem;
      local_228.fpclass =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.fpclass;
      local_228.prec_elem =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.prec_elem;
      if (fVar9 == cpp_dec_float_NaN || local_98.fpclass == cpp_dec_float_NaN) {
LAB_002e21d3:
        local_228.data._M_elems._0_8_ = *(undefined8 *)(pnVar1->m_backend).data._M_elems;
        local_228.data._M_elems._8_8_ =
             *(undefined8 *)
              ((this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).epsilon.m_backend.data._M_elems + 2);
        local_228.data._M_elems._16_8_ =
             *(undefined8 *)
              ((this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).epsilon.m_backend.data._M_elems + 4);
        uVar5 = *(undefined8 *)
                 ((this->
                  super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).epsilon.m_backend.data._M_elems + 6);
        uVar3 = *(undefined8 *)
                 ((this->
                  super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).epsilon.m_backend.data._M_elems + 8);
        local_228.data._M_elems._32_5_ = SUB85(uVar3,0);
        local_228.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_228.data._M_elems[6] = (uint)uVar5;
        local_228.data._M_elems[7] = (uint)((ulong)uVar5 >> 0x20);
        local_228.prec_elem = iVar10;
        local_228.fpclass = fVar9;
        if (local_228.data._M_elems[0] != 0 || fVar9 != cpp_dec_float_finite) {
          local_228.neg = (bool)(local_228.neg ^ 1);
        }
        if (((fVar9 != cpp_dec_float_NaN) && (local_98.fpclass != cpp_dec_float_NaN)) &&
           (local_1ec = iVar7,
           iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_98,&local_228), iVar6 < 0)) {
          ::soplex::infinity::__tls_init();
          pcVar11 = &low[iVar7].m_backend;
          local_228.fpclass = cpp_dec_float_finite;
          local_228.prec_elem = 10;
          local_228.data._M_elems[0] = 0;
          local_228.data._M_elems[1] = 0;
          local_228.data._M_elems[2] = 0;
          local_228.data._M_elems[3] = 0;
          local_228.data._M_elems[4] = 0;
          local_228.data._M_elems[5] = 0;
          local_228.data._M_elems[6] = 0;
          local_228.data._M_elems[7] = 0;
          local_228.data._M_elems._32_5_ = 0;
          local_228.data._M_elems[9]._1_3_ = 0;
          local_228.exp = 0;
          local_228.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_228,(double)CONCAT44(uStack_54,local_58))
          ;
          if (((pcVar11->fpclass != cpp_dec_float_NaN) && (local_228.fpclass != cpp_dec_float_NaN))
             && (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar11,&local_228), 0 < iVar6)) {
            local_1e8.fpclass = cpp_dec_float_finite;
            local_1e8.prec_elem = 10;
            local_1e8.data._M_elems[0] = 0;
            local_1e8.data._M_elems[1] = 0;
            local_1e8.data._M_elems[2] = 0;
            local_1e8.data._M_elems[3] = 0;
            local_1e8.data._M_elems[4] = 0;
            local_1e8.data._M_elems[5] = 0;
            local_1e8.data._M_elems._24_5_ = 0;
            local_1e8.data._M_elems[7]._1_3_ = 0;
            local_1e8.data._M_elems._32_5_ = 0;
            local_1e8.data._M_elems[9]._1_3_ = 0;
            local_1e8.exp = 0;
            local_1e8.neg = false;
            if (&local_1e8 == &vec[iVar7].m_backend) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_1e8,pcVar11);
              if (local_1e8.data._M_elems[0] != 0 || local_1e8.fpclass != cpp_dec_float_finite) {
                local_1e8.neg = (bool)(local_1e8.neg ^ 1);
                goto LAB_002e2448;
              }
LAB_002e245b:
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_228,0,(type *)0x0);
              iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_1e8,&local_228);
              if (-1 < iVar7) {
                uVar3 = *(undefined8 *)((local_168->data)._M_elems + 8);
                local_228.data._M_elems._32_5_ = SUB85(uVar3,0);
                local_228.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_228.data._M_elems._0_8_ = *(undefined8 *)(local_168->data)._M_elems;
                local_228.data._M_elems._8_8_ = *(undefined8 *)((local_168->data)._M_elems + 2);
                local_228.data._M_elems._16_8_ = *(undefined8 *)((local_168->data)._M_elems + 4);
                uVar3 = *(undefined8 *)((local_168->data)._M_elems + 6);
                local_228.data._M_elems[6] = (uint)uVar3;
                local_228.data._M_elems[7] = (uint)((ulong)uVar3 >> 0x20);
                local_228.exp =
                     (this->
                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).fastDelta.m_backend.exp;
                local_228.neg =
                     (this->
                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).fastDelta.m_backend.neg;
                local_228.fpclass =
                     (this->
                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).fastDelta.m_backend.fpclass;
                local_228.prec_elem =
                     (this->
                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).fastDelta.m_backend.prec_elem;
                pcVar11 = &local_228;
                if (local_228.fpclass != cpp_dec_float_finite || local_228.data._M_elems[0] != 0) {
                  local_228.neg = (bool)(local_228.neg ^ 1);
                }
                goto LAB_002e2579;
              }
            }
            else {
              if (&local_1e8 != pcVar11) {
                uVar3 = *(undefined8 *)((pcVar11->data)._M_elems + 8);
                local_1e8.data._M_elems._32_5_ = SUB85(uVar3,0);
                local_1e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_1e8.data._M_elems._0_8_ = *(undefined8 *)(pcVar11->data)._M_elems;
                local_1e8.data._M_elems._8_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 2);
                local_1e8.data._M_elems._16_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 4);
                uVar3 = *(undefined8 *)((pcVar11->data)._M_elems + 6);
                local_1e8.data._M_elems._24_5_ = SUB85(uVar3,0);
                local_1e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_1e8.exp = pcVar11->exp;
                local_1e8.neg = pcVar11->neg;
                local_1e8.fpclass = pcVar11->fpclass;
                local_1e8.prec_elem = pcVar11->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_1e8,&vec[iVar7].m_backend);
LAB_002e2448:
              if (local_1e8.fpclass != cpp_dec_float_NaN) goto LAB_002e245b;
            }
            local_d8.fpclass = cpp_dec_float_finite;
            local_d8.prec_elem = 10;
            local_d8.data._M_elems[0] = 0;
            local_d8.data._M_elems[1] = 0;
            local_d8.data._M_elems[2] = 0;
            local_d8.data._M_elems[3] = 0;
            local_d8.data._M_elems[4] = 0;
            local_d8.data._M_elems[5] = 0;
            local_d8.data._M_elems._24_5_ = 0;
            local_d8.data._M_elems[7]._1_3_ = 0;
            local_d8.data._M_elems._32_5_ = 0;
            local_d8.data._M_elems[9]._1_3_ = 0;
            local_d8.exp = 0;
            local_d8.neg = false;
            pcVar11 = &local_d8;
            if (pcVar11 == local_168) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (pcVar11,&local_1e8);
              if (local_d8.data._M_elems[0] != 0 || local_d8.fpclass != cpp_dec_float_finite) {
                local_d8.neg = (bool)(local_d8.neg ^ 1);
                pcVar11 = &local_d8;
              }
            }
            else {
              local_d8.data._M_elems._32_5_ = local_1e8.data._M_elems._32_5_;
              local_d8.data._M_elems[9]._1_3_ = local_1e8.data._M_elems[9]._1_3_;
              local_d8.data._M_elems[4] = local_1e8.data._M_elems[4];
              local_d8.data._M_elems[5] = local_1e8.data._M_elems[5];
              local_d8.data._M_elems._24_5_ = local_1e8.data._M_elems._24_5_;
              local_d8.data._M_elems[7]._1_3_ = local_1e8.data._M_elems[7]._1_3_;
              local_d8.data._M_elems[0] = local_1e8.data._M_elems[0];
              local_d8.data._M_elems[1] = local_1e8.data._M_elems[1];
              local_d8.data._M_elems[2] = local_1e8.data._M_elems[2];
              local_d8.data._M_elems[3] = local_1e8.data._M_elems[3];
              local_d8.exp = local_1e8.exp;
              local_d8.neg = local_1e8.neg;
              local_d8.fpclass = local_1e8.fpclass;
              local_d8.prec_elem = local_1e8.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (pcVar11,local_168);
            }
            goto LAB_002e2579;
          }
        }
      }
      else {
        iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_98,&local_228);
        if (iVar6 < 1) {
          local_228.exp =
               (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).epsilon.m_backend.exp;
          local_228.neg =
               (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).epsilon.m_backend.neg;
          fVar9 = (this->
                  super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).epsilon.m_backend.fpclass;
          iVar10 = (this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).epsilon.m_backend.prec_elem;
          goto LAB_002e21d3;
        }
        local_1ec = iVar7;
        ::soplex::infinity::__tls_init();
        pcVar11 = &upp[iVar7].m_backend;
        local_228.fpclass = cpp_dec_float_finite;
        local_228.prec_elem = 10;
        local_228.data._M_elems[0] = 0;
        local_228.data._M_elems[1] = 0;
        local_228.data._M_elems[2] = 0;
        local_228.data._M_elems[3] = 0;
        local_228.data._M_elems[4] = 0;
        local_228.data._M_elems[5] = 0;
        local_228.data._M_elems[6] = 0;
        local_228.data._M_elems[7] = 0;
        local_228.data._M_elems._32_5_ = 0;
        local_228.data._M_elems[9]._1_3_ = 0;
        local_228.exp = 0;
        local_228.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_228,local_48);
        if (((pcVar11->fpclass == cpp_dec_float_NaN) || (local_228.fpclass == cpp_dec_float_NaN)) ||
           (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (pcVar11,&local_228), -1 < iVar6)) goto LAB_002e272f;
        local_1e8.fpclass = cpp_dec_float_finite;
        local_1e8.prec_elem = 10;
        local_1e8.data._M_elems[0] = 0;
        local_1e8.data._M_elems[1] = 0;
        local_1e8.data._M_elems[2] = 0;
        local_1e8.data._M_elems[3] = 0;
        local_1e8.data._M_elems[4] = 0;
        local_1e8.data._M_elems[5] = 0;
        local_1e8.data._M_elems._24_5_ = 0;
        local_1e8.data._M_elems[7]._1_3_ = 0;
        local_1e8.data._M_elems._32_5_ = 0;
        local_1e8.data._M_elems[9]._1_3_ = 0;
        local_1e8.exp = 0;
        local_1e8.neg = false;
        if (&local_1e8 == &vec[iVar7].m_backend) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_1e8,pcVar11);
          if (local_1e8.data._M_elems[0] != 0 || local_1e8.fpclass != cpp_dec_float_finite) {
            local_1e8.neg = (bool)(local_1e8.neg ^ 1);
            goto LAB_002e237e;
          }
LAB_002e238d:
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (&local_228,0,(type *)0x0);
          iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_1e8,&local_228);
          pcVar11 = local_168;
          if (0 < iVar7) goto LAB_002e23bb;
        }
        else {
          if (&local_1e8 != pcVar11) {
            uVar3 = *(undefined8 *)((pcVar11->data)._M_elems + 8);
            local_1e8.data._M_elems._32_5_ = SUB85(uVar3,0);
            local_1e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_1e8.data._M_elems._0_8_ = *(undefined8 *)(pcVar11->data)._M_elems;
            local_1e8.data._M_elems._8_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 2);
            local_1e8.data._M_elems._16_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 4);
            uVar3 = *(undefined8 *)((pcVar11->data)._M_elems + 6);
            local_1e8.data._M_elems._24_5_ = SUB85(uVar3,0);
            local_1e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_1e8.exp = pcVar11->exp;
            local_1e8.neg = pcVar11->neg;
            local_1e8.fpclass = pcVar11->fpclass;
            local_1e8.prec_elem = pcVar11->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_1e8,&vec[iVar7].m_backend);
LAB_002e237e:
          if (local_1e8.fpclass != cpp_dec_float_NaN) goto LAB_002e238d;
LAB_002e23bb:
          local_228.fpclass = cpp_dec_float_finite;
          local_228.prec_elem = 10;
          local_228.data._M_elems[0] = 0;
          local_228.data._M_elems[1] = 0;
          local_228.data._M_elems[2] = 0;
          local_228.data._M_elems[3] = 0;
          local_228.data._M_elems[4] = 0;
          local_228.data._M_elems[5] = 0;
          local_228.data._M_elems[6] = 0;
          local_228.data._M_elems[7] = 0;
          local_228.data._M_elems._32_5_ = 0;
          local_228.data._M_elems[9]._1_3_ = 0;
          local_228.exp = 0;
          local_228.neg = false;
          v = &local_1e8;
          if (&local_228 != local_168) {
            local_228.data._M_elems._32_5_ = local_1e8.data._M_elems._32_5_;
            local_228.data._M_elems[9]._1_3_ = local_1e8.data._M_elems[9]._1_3_;
            local_228.data._M_elems[4] = local_1e8.data._M_elems[4];
            local_228.data._M_elems[5] = local_1e8.data._M_elems[5];
            local_228.data._M_elems[6] = local_1e8.data._M_elems[6];
            local_228.data._M_elems[7] =
                 (uint)(CONCAT35(local_1e8.data._M_elems[7]._1_3_,local_1e8.data._M_elems._24_5_) >>
                       0x20);
            local_228.data._M_elems[0] = local_1e8.data._M_elems[0];
            local_228.data._M_elems[1] = local_1e8.data._M_elems[1];
            local_228.data._M_elems[2] = local_1e8.data._M_elems[2];
            local_228.data._M_elems[3] = local_1e8.data._M_elems[3];
            local_228.exp = local_1e8.exp;
            local_228.neg = local_1e8.neg;
            local_228.fpclass = local_1e8.fpclass;
            local_228.prec_elem = local_1e8.prec_elem;
            v = local_168;
          }
          pcVar11 = &local_228;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=(pcVar11,v);
        }
LAB_002e2579:
        local_118.fpclass = cpp_dec_float_finite;
        local_118.prec_elem = 10;
        local_118.data._M_elems[0] = 0;
        local_118.data._M_elems[1] = 0;
        local_118.data._M_elems[2] = 0;
        local_118.data._M_elems[3] = 0;
        local_118.data._M_elems[4] = 0;
        local_118.data._M_elems[5] = 0;
        local_118.data._M_elems._24_5_ = 0;
        local_118.data._M_elems[7]._1_3_ = 0;
        local_118.data._M_elems._32_5_ = 0;
        local_118.data._M_elems[9]._1_3_ = 0;
        local_118.exp = 0;
        local_118.neg = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_118,pcVar11,&local_98);
        local_1a8.data._M_elems._32_5_ = local_118.data._M_elems._32_5_;
        local_1a8.data._M_elems[9]._1_3_ = local_118.data._M_elems[9]._1_3_;
        local_1a8.data._M_elems[4] = local_118.data._M_elems[4];
        local_1a8.data._M_elems[5] = local_118.data._M_elems[5];
        local_1a8.data._M_elems._24_5_ = local_118.data._M_elems._24_5_;
        local_1a8.data._M_elems[7]._1_3_ = local_118.data._M_elems[7]._1_3_;
        local_1a8.data._M_elems[0] = local_118.data._M_elems[0];
        local_1a8.data._M_elems[1] = local_118.data._M_elems[1];
        local_1a8.data._M_elems[2] = local_118.data._M_elems[2];
        local_1a8.data._M_elems[3] = local_118.data._M_elems[3];
        local_1a8.exp = local_118.exp;
        local_1a8.neg = local_118.neg;
        local_1a8.fpclass = local_118.fpclass;
        local_1a8.prec_elem = local_118.prec_elem;
        pBVar4 = (local_160->data).
                 super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pBVar4[*nBp].idx = local_1ec;
        iVar7 = *nBp;
        pBVar4[iVar7].src = src;
        *(undefined8 *)&pBVar4[iVar7].val.m_backend = local_118.data._M_elems._0_8_;
        *(undefined8 *)((long)&pBVar4[iVar7].val.m_backend + 8) = local_118.data._M_elems._8_8_;
        puVar2 = (uint *)((long)&pBVar4[iVar7].val.m_backend + 0x10);
        *(undefined8 *)puVar2 = local_118.data._M_elems._16_8_;
        *(ulong *)(puVar2 + 2) =
             CONCAT35(local_118.data._M_elems[7]._1_3_,local_118.data._M_elems._24_5_);
        *(ulong *)((long)&pBVar4[iVar7].val.m_backend + 0x20) =
             CONCAT35(local_118.data._M_elems[9]._1_3_,local_118.data._M_elems._32_5_);
        *(int *)((long)&pBVar4[iVar7].val.m_backend + 0x28) = local_118.exp;
        *(bool *)((long)&pBVar4[iVar7].val.m_backend + 0x2c) = local_118.neg;
        *(undefined8 *)((long)&pBVar4[iVar7].val.m_backend + 0x30) = local_118._48_8_;
        if ((local_118.fpclass == cpp_dec_float_NaN) || (local_158.fpclass == cpp_dec_float_NaN)) {
          iVar7 = *nBp;
        }
        else {
          iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_1a8,&local_158);
          iVar7 = *nBp;
          if (iVar6 < 0) {
            local_158.data._M_elems[9]._1_3_ = local_1a8.data._M_elems[9]._1_3_;
            local_158.data._M_elems._32_5_ = local_1a8.data._M_elems._32_5_;
            local_158.data._M_elems[7]._1_3_ = local_1a8.data._M_elems[7]._1_3_;
            local_158.data._M_elems._24_5_ = local_1a8.data._M_elems._24_5_;
            local_158.data._M_elems[4] = local_1a8.data._M_elems[4];
            local_158.data._M_elems[5] = local_1a8.data._M_elems[5];
            local_158.data._M_elems[0] = local_1a8.data._M_elems[0];
            local_158.data._M_elems[1] = local_1a8.data._M_elems[1];
            local_158.data._M_elems[2] = local_1a8.data._M_elems[2];
            local_158.data._M_elems[3] = local_1a8.data._M_elems[3];
            local_158.exp = local_1a8.exp;
            local_158.neg = local_1a8.neg;
            local_158.fpclass = local_1a8.fpclass;
            local_158.prec_elem = local_1a8.prec_elem;
            *local_e0 = iVar7;
          }
        }
        *nBp = iVar7 + 1;
      }
LAB_002e272f:
      if ((int)((ulong)((long)(this->breakpoints).data.
                              super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->breakpoints).data.
                             super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6) <= *nBp) {
        std::
        vector<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
        ::resize(&local_160->data,(long)*nBp * 2);
      }
      idx = idx + 1;
    } while (idx < local_a0);
  }
  return;
}

Assistant:

void SPxBoundFlippingRT<R>::collectBreakpointsMax(
   int&                  nBp,                /**< number of found breakpoints so far */
   int&                  minIdx,             /**< index to current minimal breakpoint */
   const int*            idx,                /**< pointer to indices of current VectorBase<R> */
   int                   nnz,                /**< number of nonzeros in current VectorBase<R> */
   const R*           upd,                /**< pointer to update values of current VectorBase<R> */
   const R*           vec,                /**< pointer to values of current VectorBase<R> */
   const R*           upp,                /**< pointer to upper bound/rhs of current VectorBase<R> */
   const R*           low,                /**< pointer to lower bound/lhs of current VectorBase<R> */
   BreakpointSource      src                 /**< type of VectorBase<R> (pVec, coPvec or fVec)*/
)
{
   R minVal;
   R curVal;
   const int* last;

   minVal = (nBp == 0) ? R(infinity) : breakpoints[minIdx].val;

   last = idx + nnz;

   for(; idx < last; ++idx)
   {
      int i = *idx;
      R x = upd[i];

      if(x > this->epsilonZero())
      {
         if(upp[i] < R(infinity))
         {
            R y = upp[i] - vec[i];
            curVal = (y <= 0) ? this->fastDelta / x : (y + this->fastDelta) / x;
            assert(curVal > 0);

            breakpoints[nBp].idx = i;
            breakpoints[nBp].src = src;
            breakpoints[nBp].val = curVal;

            if(curVal < minVal)
            {
               minVal = curVal;
               minIdx = nBp;
            }

            nBp++;
         }
      }
      else if(x < -this->epsilonZero())
      {
         if(low[i] > R(-infinity))
         {
            R y = low[i] - vec[i];
            curVal = (y >= 0) ? -this->fastDelta / x : (y - this->fastDelta) / x;
            assert(curVal > 0);

            breakpoints[nBp].idx = i;
            breakpoints[nBp].src = src;
            breakpoints[nBp].val = curVal;

            if(curVal < minVal)
            {
               minVal = curVal;
               minIdx = nBp;
            }

            nBp++;
         }
      }

      if(nBp >= breakpoints.size())
         breakpoints.reSize(nBp * 2);
   }

   return;
}